

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStruct<Js::SerializedFieldList>
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,
          SerializedFieldList *value)

{
  BufferBuilder *value_00;
  ImmutableList<Js::BufferBuilder_*> *pIVar1;
  
  value_00 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x20,this->alloc,0x35916e);
  value_00->clue = clue;
  value_00->offset = 0xffffffff;
  *(SerializedFieldList *)&value_00->field_0x14 = *value;
  value_00->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_0137aa28;
  pIVar1 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend(builder->list,value_00,this->alloc);
  builder->list = pIVar1;
  return 8;
}

Assistant:

uint32 PrependStruct(BufferBuilderList & builder, LPCWSTR clue, TStructType * value)
    {
        auto entry = Anew(alloc, ConstantSizedBufferBuilderOf<TStructType>, clue, *value);
        builder.list = builder.list->Prepend(entry, alloc);

        return sizeof(serialization_alignment TStructType);
    }